

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O0

void av1_get_block_hash_value
               (IntraBCHashInfo *intrabc_hash_info,uint8_t *y_src,int stride,int block_size,
               uint32_t *hash_value1,uint32_t *hash_value2,int use_highbitdepth)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int *in_R8;
  undefined4 *in_R9;
  int in_stack_00000008;
  int srcPos;
  int x_pos_2;
  int y_pos_2;
  int dst_pos;
  int sub_width;
  uint32_t to_hash [4];
  int dst_idx;
  int src_idx;
  int src_sub_block_in_width;
  int pos_1;
  int x_pos_1;
  int y_pos_1;
  uint8_t pixel_to_hash_1 [4];
  int pos;
  int x_pos;
  int y_pos;
  uint16_t *y16_src;
  uint16_t pixel_to_hash [4];
  int sub_block_in_width;
  uint32_t **buf_2;
  uint32_t **buf_1;
  CRC_CALCULATOR *calc_2;
  CRC_CALCULATOR *calc_1;
  int crc_mask;
  int add_value;
  uint8_t *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_90;
  int local_80;
  int local_7c;
  uint8_t local_78 [4];
  int local_74;
  int local_70;
  int local_6c;
  long local_68;
  uint16_t local_5c [4];
  int local_54;
  long *local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  undefined4 local_30;
  int local_2c;
  undefined4 *local_28;
  int *local_20;
  int local_18;
  int local_14;
  long local_10;
  long *local_8;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_2c = hash_block_size_to_index(in_ECX);
  local_2c = local_2c << 0x10;
  local_30 = 0xffff;
  local_38 = local_8 + 5;
  local_40 = local_8 + 0x87;
  local_48 = local_8;
  local_50 = local_8 + 2;
  local_54 = local_18 >> 1;
  if (in_stack_00000008 == 0) {
    for (local_7c = 0; local_7c < local_18; local_7c = local_7c + 2) {
      for (local_80 = 0; local_80 < local_18; local_80 = local_80 + 2) {
        iVar2 = (local_7c >> 1) * local_54 + (local_80 >> 1);
        get_pixels_in_1D_char_array_by_block_2x2
                  ((uint8_t *)(local_10 + local_7c * local_14 + (long)local_80),local_14,local_78);
        uVar1 = av1_get_crc_value((CRC_CALCULATOR *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                  in_stack_ffffffffffffff38,0);
        *(uint32_t *)(*local_48 + (long)iVar2 * 4) = uVar1;
        uVar1 = av1_get_crc_value((CRC_CALCULATOR *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                  in_stack_ffffffffffffff38,0);
        *(uint32_t *)(*local_50 + (long)iVar2 * 4) = uVar1;
      }
    }
  }
  else {
    local_68 = local_10 << 1;
    for (local_6c = 0; local_6c < local_18; local_6c = local_6c + 2) {
      for (local_70 = 0; local_70 < local_18; local_70 = local_70 + 2) {
        local_74 = (local_6c >> 1) * local_54 + (local_70 >> 1);
        get_pixels_in_1D_short_array_by_block_2x2
                  ((uint16_t *)(local_68 + (long)(local_6c * local_14) * 2 + (long)local_70 * 2),
                   local_14,local_5c);
        uVar1 = av1_get_crc_value((CRC_CALCULATOR *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                  in_stack_ffffffffffffff38,0);
        *(uint32_t *)(*local_48 + (long)local_74 * 4) = uVar1;
        uVar1 = av1_get_crc_value((CRC_CALCULATOR *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                  in_stack_ffffffffffffff38,0);
        *(uint32_t *)(*local_50 + (long)local_74 * 4) = uVar1;
      }
    }
  }
  local_90 = 0;
  iVar2 = local_54;
  for (local_ac = 4; local_54 = iVar2 >> 1, local_ac <= local_18; local_ac = local_ac << 1) {
    local_90 = 1 - local_90;
    local_b0 = 0;
    for (local_b4 = 0; local_b4 < local_54; local_b4 = local_b4 + 1) {
      for (local_b8 = 0; local_b8 < local_54; local_b8 = local_b8 + 1) {
        iVar3 = local_b4 * 2 * iVar2 + local_b8 * 2;
        uVar1 = av1_get_crc_value((CRC_CALCULATOR *)CONCAT44(iVar3,in_stack_ffffffffffffff40),
                                  in_stack_ffffffffffffff38,0);
        *(uint32_t *)(local_48[local_90] + (long)local_b0 * 4) = uVar1;
        uVar1 = av1_get_crc_value((CRC_CALCULATOR *)CONCAT44(iVar3,in_stack_ffffffffffffff40),
                                  in_stack_ffffffffffffff38,0);
        *(uint32_t *)(local_50[local_90] + (long)local_b0 * 4) = uVar1;
        local_b0 = local_b0 + 1;
      }
    }
    iVar2 = local_54;
  }
  *local_20 = (*(uint *)local_48[local_90] & 0xffff) + local_2c;
  *local_28 = *(undefined4 *)local_50[local_90];
  return;
}

Assistant:

void av1_get_block_hash_value(IntraBCHashInfo *intrabc_hash_info,
                              const uint8_t *y_src, int stride, int block_size,
                              uint32_t *hash_value1, uint32_t *hash_value2,
                              int use_highbitdepth) {
  int add_value = hash_block_size_to_index(block_size);
  assert(add_value >= 0);
  add_value <<= kSrcBits;
  const int crc_mask = (1 << kSrcBits) - 1;

  CRC_CALCULATOR *calc_1 = &intrabc_hash_info->crc_calculator1;
  CRC_CALCULATOR *calc_2 = &intrabc_hash_info->crc_calculator2;
  uint32_t **buf_1 = intrabc_hash_info->hash_value_buffer[0];
  uint32_t **buf_2 = intrabc_hash_info->hash_value_buffer[1];

  // 2x2 subblock hash values in current CU
  int sub_block_in_width = (block_size >> 1);
  if (use_highbitdepth) {
    uint16_t pixel_to_hash[4];
    uint16_t *y16_src = CONVERT_TO_SHORTPTR(y_src);
    for (int y_pos = 0; y_pos < block_size; y_pos += 2) {
      for (int x_pos = 0; x_pos < block_size; x_pos += 2) {
        int pos = (y_pos >> 1) * sub_block_in_width + (x_pos >> 1);
        get_pixels_in_1D_short_array_by_block_2x2(
            y16_src + y_pos * stride + x_pos, stride, pixel_to_hash);
        assert(pos < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        buf_1[0][pos] = av1_get_crc_value(calc_1, (uint8_t *)pixel_to_hash,
                                          sizeof(pixel_to_hash));
        buf_2[0][pos] = av1_get_crc_value(calc_2, (uint8_t *)pixel_to_hash,
                                          sizeof(pixel_to_hash));
      }
    }
  } else {
    uint8_t pixel_to_hash[4];
    for (int y_pos = 0; y_pos < block_size; y_pos += 2) {
      for (int x_pos = 0; x_pos < block_size; x_pos += 2) {
        int pos = (y_pos >> 1) * sub_block_in_width + (x_pos >> 1);
        get_pixels_in_1D_char_array_by_block_2x2(y_src + y_pos * stride + x_pos,
                                                 stride, pixel_to_hash);
        assert(pos < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        buf_1[0][pos] =
            av1_get_crc_value(calc_1, pixel_to_hash, sizeof(pixel_to_hash));
        buf_2[0][pos] =
            av1_get_crc_value(calc_2, pixel_to_hash, sizeof(pixel_to_hash));
      }
    }
  }

  int src_sub_block_in_width = sub_block_in_width;
  sub_block_in_width >>= 1;

  int src_idx = 1;
  int dst_idx = 0;

  // 4x4 subblock hash values to current block hash values
  uint32_t to_hash[4];
  for (int sub_width = 4; sub_width <= block_size; sub_width *= 2) {
    src_idx = 1 - src_idx;
    dst_idx = 1 - dst_idx;

    int dst_pos = 0;
    for (int y_pos = 0; y_pos < sub_block_in_width; y_pos++) {
      for (int x_pos = 0; x_pos < sub_block_in_width; x_pos++) {
        int srcPos = (y_pos << 1) * src_sub_block_in_width + (x_pos << 1);

        assert(srcPos + 1 < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        assert(srcPos + src_sub_block_in_width + 1 <
               AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        assert(dst_pos < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        to_hash[0] = buf_1[src_idx][srcPos];
        to_hash[1] = buf_1[src_idx][srcPos + 1];
        to_hash[2] = buf_1[src_idx][srcPos + src_sub_block_in_width];
        to_hash[3] = buf_1[src_idx][srcPos + src_sub_block_in_width + 1];

        buf_1[dst_idx][dst_pos] =
            av1_get_crc_value(calc_1, (uint8_t *)to_hash, sizeof(to_hash));

        to_hash[0] = buf_2[src_idx][srcPos];
        to_hash[1] = buf_2[src_idx][srcPos + 1];
        to_hash[2] = buf_2[src_idx][srcPos + src_sub_block_in_width];
        to_hash[3] = buf_2[src_idx][srcPos + src_sub_block_in_width + 1];
        buf_2[dst_idx][dst_pos] =
            av1_get_crc_value(calc_2, (uint8_t *)to_hash, sizeof(to_hash));
        dst_pos++;
      }
    }

    src_sub_block_in_width = sub_block_in_width;
    sub_block_in_width >>= 1;
  }

  *hash_value1 = (buf_1[dst_idx][0] & crc_mask) + add_value;
  *hash_value2 = buf_2[dst_idx][0];
}